

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

void xmlVErrMemory(xmlValidCtxtPtr ctxt)

{
  void *data;
  xmlGenericErrorFunc channel;
  
  if (ctxt == (xmlValidCtxtPtr)0x0) {
    channel = (xmlGenericErrorFunc)0x0;
    data = (void *)0x0;
  }
  else {
    if ((ctxt->flags & 2) != 0) {
      xmlCtxtErrMemory((xmlParserCtxtPtr)ctxt->userData);
      return;
    }
    data = ctxt->userData;
    channel = ctxt->error;
  }
  xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,channel,data,0x17,(xmlError *)0x0);
  return;
}

Assistant:

static void
xmlVErrMemory(xmlValidCtxtPtr ctxt)
{
    if (ctxt != NULL) {
        if (ctxt->flags & XML_VCTXT_USE_PCTXT) {
            xmlCtxtErrMemory(ctxt->userData);
        } else {
            xmlRaiseMemoryError(NULL, ctxt->error, ctxt->userData,
                                XML_FROM_VALID, NULL);
        }
    } else {
        xmlRaiseMemoryError(NULL, NULL, NULL, XML_FROM_VALID, NULL);
    }
}